

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O1

Vec_Int_t * Wlc_NtkCollectOneType(Wlc_Ntk_t *p,Vec_Int_t *vMemObjsClean,int Type1,int Type2)

{
  int Entry;
  uint uVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  long lVar3;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(400);
  p_00->pArray = piVar2;
  if (0 < vMemObjsClean->nSize) {
    lVar3 = 0;
    do {
      Entry = vMemObjsClean->pArray[lVar3];
      if (((long)Entry < 1) || (p->nObjsAlloc <= Entry)) {
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      uVar1 = *(ushort *)(p->pObjs + Entry) & 0x3f;
      if (uVar1 == Type1 || uVar1 == Type2) {
        Vec_IntPush(p_00,Entry);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < vMemObjsClean->nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Wlc_NtkCollectOneType( Wlc_Ntk_t * p, Vec_Int_t * vMemObjsClean, int Type1, int Type2 )
{
    Wlc_Obj_t * pObj; int i;
    Vec_Int_t * vRes = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObjVec( vMemObjsClean, p, pObj, i )
        if ( Wlc_ObjType(pObj) == Type1 || Wlc_ObjType(pObj) == Type2 )
            Vec_IntPush( vRes, Wlc_ObjId(p, pObj) );
    return vRes;
}